

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall chaiscript::exception::eval_error::pretty_print_abi_cxx11_(eval_error *this)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  string *psVar6;
  ostream *poVar7;
  long *in_RSI;
  string *in_RDI;
  size_t j;
  ostringstream ss;
  shared_ptr<const_chaiscript::AST_Node> *in_stack_fffffffffffffcf8;
  string local_240 [32];
  string local_220 [32];
  ulong local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [48];
  ostringstream local_188 [32];
  shared_ptr<const_chaiscript::AST_Node> *in_stack_fffffffffffffe98;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  pcVar3 = (char *)(**(code **)(*in_RSI + 0x10))();
  std::operator<<((ostream *)local_188,pcVar3);
  sVar4 = std::
          vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
          ::size((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0xf));
  if (sVar4 != 0) {
    poVar5 = std::operator<<((ostream *)local_188,"during evaluation at (");
    std::
    vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0xf),0);
    psVar6 = fname<std::shared_ptr<chaiscript::AST_Node_const>>
                       ((shared_ptr<const_chaiscript::AST_Node> *)0x362368);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5," ");
    std::
    vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0xf),0);
    startpos<std::shared_ptr<chaiscript::AST_Node_const>>(in_stack_fffffffffffffe98);
    poVar5 = std::operator<<(poVar5,local_1b8);
    std::operator<<(poVar5,")\n");
    std::__cxx11::string::~string(local_1b8);
    poVar5 = std::operator<<((ostream *)local_188,'\n');
    poVar5 = std::operator<<(poVar5,(string *)(in_RSI + 0xb));
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)local_188,"  ");
    std::
    vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0xf),0);
    psVar6 = fname<std::shared_ptr<chaiscript::AST_Node_const>>
                       ((shared_ptr<const_chaiscript::AST_Node> *)0x3624a3);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5," (");
    std::
    vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0xf),0);
    startpos<std::shared_ptr<chaiscript::AST_Node_const>>(in_stack_fffffffffffffe98);
    poVar5 = std::operator<<(poVar5,local_1d8);
    poVar5 = std::operator<<(poVar5,") \'");
    std::
    vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0xf),0);
    pretty<std::shared_ptr<chaiscript::AST_Node_const>>(in_stack_fffffffffffffcf8);
    poVar5 = std::operator<<(poVar5,local_1f8);
    std::operator<<(poVar5,"\'");
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string(local_1d8);
    for (local_200 = 1; uVar1 = local_200,
        sVar4 = std::
                vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                ::size((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                        *)(in_RSI + 0xf)), uVar1 < sVar4; local_200 = local_200 + 1) {
      std::
      vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
      ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                    *)(in_RSI + 0xf),local_200);
      iVar2 = id<std::shared_ptr<chaiscript::AST_Node_const>>
                        ((shared_ptr<const_chaiscript::AST_Node> *)0x3625f9);
      if (iVar2 != 0x17) {
        std::
        vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
        ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                      *)(in_RSI + 0xf),local_200);
        iVar2 = id<std::shared_ptr<chaiscript::AST_Node_const>>
                          ((shared_ptr<const_chaiscript::AST_Node> *)0x36262d);
        if (iVar2 != 0x1f) {
          std::operator<<((ostream *)local_188,'\n');
          poVar5 = std::operator<<((ostream *)local_188,"  from ");
          std::
          vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
          ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                        *)(in_RSI + 0xf),local_200);
          psVar6 = fname<std::shared_ptr<chaiscript::AST_Node_const>>
                             ((shared_ptr<const_chaiscript::AST_Node> *)0x362690);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          poVar5 = std::operator<<(poVar5," (");
          std::
          vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
          ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                        *)(in_RSI + 0xf),local_200);
          startpos<std::shared_ptr<chaiscript::AST_Node_const>>(in_stack_fffffffffffffe98);
          poVar5 = std::operator<<(poVar5,local_220);
          poVar7 = std::operator<<(poVar5,") \'");
          std::
          vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
          ::operator[]((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                        *)(in_RSI + 0xf),local_200);
          pretty<std::shared_ptr<chaiscript::AST_Node_const>>
                    ((shared_ptr<const_chaiscript::AST_Node> *)poVar5);
          poVar5 = std::operator<<(poVar7,local_240);
          std::operator<<(poVar5,"\'");
          std::__cxx11::string::~string(local_240);
          std::__cxx11::string::~string(local_220);
        }
      }
    }
  }
  std::operator<<((ostream *)local_188,'\n');
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string pretty_print() const
      {
        std::ostringstream ss;

        ss << what();
        if (call_stack.size() > 0) {
          ss << "during evaluation at (" << fname(call_stack[0]) << " " << startpos(call_stack[0]) << ")\n";
          ss << '\n' << detail << '\n';
          ss << "  " << fname(call_stack[0]) << " (" << startpos(call_stack[0]) << ") '" << pretty(call_stack[0]) << "'";
          for (size_t j = 1; j < call_stack.size(); ++j) {
            if (id(call_stack[j]) != chaiscript::AST_Node_Type::Block
                && id(call_stack[j]) != chaiscript::AST_Node_Type::File)
            {
              ss << '\n';
              ss << "  from " << fname(call_stack[j]) << " (" << startpos(call_stack[j]) << ") '" << pretty(call_stack[j]) << "'";
            }
          }
        }
        ss << '\n';
        return ss.str();
      }